

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expr * __thiscall Parser::primary_expression(Parser *this)

{
  int iVar1;
  bool bVar2;
  pointer pUVar3;
  char *__nptr;
  long lVar4;
  pointer pLVar5;
  Expr *pEVar6;
  string local_60;
  unique_ptr<Literal,_std::default_delete<Literal>_> local_40;
  __single_object l;
  __single_object be;
  unique_ptr<Expr,_std::default_delete<Expr>_> local_20;
  unique_ptr<Expr,_std::default_delete<Expr>_> e;
  Parser *this_local;
  
  e._M_t.super___uniq_ptr_impl<Expr,_std::default_delete<Expr>_>._M_t.
  super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.super__Head_base<0UL,_Expr_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Expr,_std::default_delete<Expr>,_true,_true>)
                 (__uniq_ptr_data<Expr,_std::default_delete<Expr>,_true,_true>)this;
  bVar2 = is_punctuator(this,'(');
  if (bVar2) {
    next_token(this);
    pEVar6 = expression(this);
    std::unique_ptr<Expr,std::default_delete<Expr>>::unique_ptr<std::default_delete<Expr>,void>
              ((unique_ptr<Expr,std::default_delete<Expr>> *)&local_20,pEVar6);
    bVar2 = is_punctuator(this,')');
    if (!bVar2) {
      error<char_const(&)[34]>(this,(char (*) [34])"expected \')\' to finish expression");
    }
    next_token(this);
    this_local = (Parser *)std::unique_ptr<Expr,_std::default_delete<Expr>_>::release(&local_20);
    std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr(&local_20);
  }
  else {
    bVar2 = is_punctuator(this,'*');
    if ((((!bVar2) && (bVar2 = is_punctuator(this,'&'), !bVar2)) &&
        (bVar2 = is_punctuator(this,'+'), !bVar2)) &&
       (((bVar2 = is_punctuator(this,'-'), !bVar2 && (bVar2 = is_punctuator(this,'!'), !bVar2)) &&
        (bVar2 = is_punctuator(this,'~'), !bVar2)))) {
      bVar2 = is(this,NumericConstant);
      if (!bVar2) {
        return (Expr *)0x0;
      }
      std::make_unique<Literal>();
      LexData::id_text_abi_cxx11_(&local_60,this->lex_data,this->tok);
      __nptr = (char *)std::__cxx11::string::c_str();
      lVar4 = strtol(__nptr,(char **)0x0,0);
      pLVar5 = std::unique_ptr<Literal,_std::default_delete<Literal>_>::operator->(&local_40);
      pLVar5->value = (int)lVar4;
      std::__cxx11::string::~string((string *)&local_60);
      next_token(this);
      pEVar6 = (Expr *)std::unique_ptr<Literal,_std::default_delete<Literal>_>::release(&local_40);
      std::unique_ptr<Literal,_std::default_delete<Literal>_>::~unique_ptr(&local_40);
      return pEVar6;
    }
    std::make_unique<UnaryExpr>();
    iVar1 = this->tok->i;
    pUVar3 = std::unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_>::operator->
                       ((unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_> *)&l);
    pUVar3->op = (char)iVar1;
    next_token(this);
    pEVar6 = primary_expression(this);
    pUVar3 = std::unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_>::operator->
                       ((unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_> *)&l);
    pUVar3->operand = pEVar6;
    pUVar3 = std::unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_>::operator->
                       ((unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_> *)&l);
    if (pUVar3->operand == (Expr *)0x0) {
      error<char_const(&)[38]>(this,(char (*) [38])"expected primary expression after \'-\'");
    }
    this_local = (Parser *)
                 std::unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_>::release
                           ((unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_> *)&l);
    std::unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_>::~unique_ptr
              ((unique_ptr<UnaryExpr,_std::default_delete<UnaryExpr>_> *)&l);
  }
  return (Expr *)this_local;
}

Assistant:

Expr* Parser::primary_expression()
{
  if (is_punctuator('(')) {
    next_token();               // Skip '('
    std::unique_ptr<Expr> e(expression());
    if (!is_punctuator(')'))
      error("expected ')' to finish expression");
    next_token();
    return e.release();
  }
  else if (is_punctuator('*') ||
           is_punctuator('&') ||
           is_punctuator('+') ||
           is_punctuator('-') ||
           is_punctuator('!') ||
           is_punctuator('~')) {
    auto be = std::make_unique<UnaryExpr>();
    be->op = tok->i;
    next_token();
    be->operand = primary_expression();
    if (!be->operand)
      error("expected primary expression after '-'");
    return be.release();
  }
  else if (is(TokenKind::NumericConstant)) {
    auto l = std::make_unique<Literal>();
    l->value = std::strtol(lex_data->id_text(*tok).c_str(), nullptr, 0);
    next_token();
    return l.release();
  }
  return nullptr;
}